

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeReaderInit(NodeReader *p,char *aNode,int nNode)

{
  int iVar1;
  int in_EDX;
  char *in_RSI;
  NodeReader *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  memset(in_RDI,0,0x38);
  in_RDI->aNode = in_RSI;
  in_RDI->nNode = in_EDX;
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    in_RDI->iOff = 1;
  }
  else {
    iVar1 = sqlite3Fts3GetVarint(in_RSI,(sqlite_int64 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    in_RDI->iOff = iVar1 + 1;
  }
  if (in_RSI == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = nodeReaderNext(in_RDI);
  }
  return iVar1;
}

Assistant:

static int nodeReaderInit(NodeReader *p, const char *aNode, int nNode){
  memset(p, 0, sizeof(NodeReader));
  p->aNode = aNode;
  p->nNode = nNode;

  /* Figure out if this is a leaf or an internal node. */
  if( aNode && aNode[0] ){
    /* An internal node. */
    p->iOff = 1 + sqlite3Fts3GetVarint(&p->aNode[1], &p->iChild);
  }else{
    p->iOff = 1;
  }

  return aNode ? nodeReaderNext(p) : SQLITE_OK;
}